

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void check_labels(c2m_ctx_t c2m_ctx,node_t_conflict labels,node_t_conflict target)

{
  ulong uVar1;
  uint uVar2;
  check_ctx *pcVar3;
  type *ptVar4;
  ulong *puVar5;
  node_t_conflict pnVar6;
  byte *pbVar7;
  int *piVar8;
  symbol_t el_00;
  int iVar9;
  uint uVar10;
  node_t pnVar11;
  void *pvVar12;
  mir_size_t mVar13;
  long lVar14;
  node_t pnVar15;
  char *pcVar16;
  node_t_conflict offset;
  uint *puVar17;
  int extraout_EDX;
  node_t_conflict *base;
  long lVar18;
  uint *puVar19;
  type *ptVar20;
  node_code_t nVar21;
  node_t_conflict pnVar22;
  node_t_conflict pnVar23;
  ulong uVar24;
  c2m_ctx_t htab;
  c2m_ctx_t c2m_ctx_00;
  char *in_R8;
  code *pcVar25;
  node_t *ppnVar26;
  uint uVar27;
  node_code_t nVar28;
  undefined8 *puVar29;
  node_t pnVar30;
  node_code_t nVar31;
  bool bVar32;
  pos_t pVar33;
  symbol_t el;
  undefined4 uStack_8c;
  undefined8 uStack_78;
  undefined8 uStack_70;
  VARR_node_t *pVStack_68;
  symbol_t local_60;
  
  pnVar15 = (labels->u).ops.head;
  if (pnVar15 == (node_t)0x0) {
    return;
  }
  pcVar3 = c2m_ctx->check_ctx;
LAB_00188f35:
  nVar21 = pnVar15->code;
  pcVar16 = (char *)(ulong)nVar21;
  if (nVar21 == N_LABEL) {
    pnVar22 = (pnVar15->u).ops.head;
    el_00._4_4_ = uStack_8c;
    el_00.mode = 2;
    el_00.id = pnVar22;
    el_00.scope = pcVar3->func_block_scope;
    el_00.def_node = (node_t_conflict)uStack_78;
    el_00.aux_node = (node_t_conflict)uStack_70;
    el_00.defs = pVStack_68;
    iVar9 = HTAB_symbol_t_do(c2m_ctx->symbol_tab,el_00,HTAB_FIND,&local_60);
    if (iVar9 == 0) {
      in_R8 = (char *)target;
      symbol_insert(c2m_ctx,S_LABEL,pnVar22,pcVar3->func_block_scope,target,(node_t_conflict)0x0);
      goto LAB_0018900c;
    }
    pVar33 = get_node_pos(c2m_ctx,pnVar22);
    in_R8 = (pnVar22->u).s.s;
    pcVar16 = "label %s redeclaration";
LAB_00189005:
    error(c2m_ctx,pcVar16,pVar33.fname,pVar33._8_8_);
  }
  else {
    if (pcVar3->curr_switch == (node_t_conflict)0x0) {
      pVar33 = get_node_pos(c2m_ctx,pnVar15);
      in_R8 = "default label";
      if (pnVar15->code == N_CASE) {
        in_R8 = "case label";
      }
      pcVar16 = "%s not within a switch-stmt";
      goto LAB_00189005;
    }
    if (nVar21 == N_CASE) {
      pnVar22 = (pnVar15->u).ops.head;
      pnVar23 = (pnVar15->u).ops.head;
      if (pnVar23 != (node_t_conflict)0x0) {
        pnVar23 = (pnVar23->op_link).next;
      }
    }
    else {
      pnVar22 = (node_t_conflict)0x0;
      pnVar23 = (node_t_conflict)0x0;
    }
    ptVar4 = (type *)pcVar3->curr_switch->attr;
    pnVar30 = *(node_t *)&ptVar4[1].align;
    if (pnVar30 == (node_t)0x0) {
      bVar32 = false;
    }
    else {
      bVar32 = **(int **)pnVar30 == 0x51;
    }
    if (pnVar22 == (node_t_conflict)0x0) {
      uVar10 = 1;
      if (bVar32) {
        pVar33 = get_node_pos(c2m_ctx,pnVar15);
        uVar10 = 0;
        pcVar16 = "multiple default labels in one switch";
        error(c2m_ctx,0x1c24f8,pVar33.fname,pVar33._8_8_);
      }
    }
    else {
      uVar10 = check_case_expr(c2m_ctx,pnVar22,ptVar4,target);
      pcVar16 = (char *)target;
      if (pnVar23 != (node_t_conflict)0x0) {
        iVar9 = check_case_expr(c2m_ctx,pnVar23,ptVar4,target);
        uVar10 = (uint)(uVar10 != 0 && iVar9 != 0);
        pcVar25 = error;
        if (c2m_ctx->options->pedantic_p == 0) {
          pcVar25 = warning;
        }
        pVar33 = get_node_pos(c2m_ctx,pnVar15);
        pcVar16 = "range cases are not a part of C standard";
        (*pcVar25)(c2m_ctx,pVar33.fname,pVar33._8_8_);
      }
    }
    if (uVar10 == 0) goto LAB_0018900c;
    ppnVar26 = (node_t *)&ptVar4[1].mode;
    pnVar22 = (node_t_conflict)0x20;
    htab = c2m_ctx;
    pnVar11 = (node_t)reg_malloc(c2m_ctx,0x20);
    *(node_t *)pnVar11 = pnVar15;
    pnVar11->attr = target;
    if (bVar32) {
      if ((pnVar30 == (node_t)0x0) || (*(long *)&ptVar4[1].align == 0)) {
        check_labels_cold_5();
LAB_001891e1:
        check_labels_cold_1();
LAB_001891e6:
        check_labels_cold_3();
LAB_001891eb:
        check_labels_cold_2();
LAB_001891f0:
        check_labels_cold_4();
        puVar5 = (ulong *)htab->env[0].__jmpbuf[5];
        if (puVar5 == (ulong *)0x0) {
          HTAB_case_t_do_cold_8();
          offset = (node_t_conflict)pcVar16;
          pnVar23 = pnVar22;
        }
        else {
          puVar29 = (undefined8 *)htab->env[0].__jmpbuf[4];
          offset = (node_t_conflict)pcVar16;
          pnVar23 = pnVar22;
          in_R8 = (char *)htab;
          if (puVar29 != (undefined8 *)0x0) {
            uVar10 = (uint)*puVar5;
            pnVar6 = (node_t_conflict)htab->env[0].__jmpbuf[0];
            offset = pnVar6;
            uVar27 = uVar10;
            if ((extraout_EDX != 1) || (iVar9 = (int)*puVar29, *(int *)&htab->options != iVar9))
            goto LAB_0018938c;
            c2m_ctx_00 = (c2m_ctx_t)puVar5[2];
            if (c2m_ctx_00 == (c2m_ctx_t)0x0) goto LAB_001894c9;
            uVar27 = uVar10 * 2;
            uVar24 = (ulong)uVar27;
            if (puVar5[1] != uVar24) {
              pnVar23 = (node_t_conflict)(uVar24 * 4);
              pvVar12 = realloc(c2m_ctx_00,(size_t)pnVar23);
              puVar5[2] = (ulong)pvVar12;
            }
            puVar5[1] = uVar24;
            *puVar5 = uVar24;
            lVar14 = htab->env[0].__jmpbuf[5];
            if (lVar14 == 0) goto LAB_001894ce;
            if (uVar27 != 0) {
              c2m_ctx_00 = *(c2m_ctx_t *)(lVar14 + 0x10);
              pnVar23 = (node_t_conflict)0xff;
              memset(c2m_ctx_00,0xff,(ulong)(uVar10 & 0x7fffffff) << 3);
            }
            puVar5 = (ulong *)htab->env[0].__jmpbuf[4];
            if ((puVar5 == (ulong *)0x0) ||
               (c2m_ctx_00 = (c2m_ctx_t)puVar5[2], c2m_ctx_00 == (c2m_ctx_t)0x0)) goto LAB_001894c4;
            uVar24 = (ulong)(uint)(iVar9 * 2);
            if (puVar5[1] != uVar24) {
              pnVar23 = (node_t_conflict)(uVar24 << 4);
              pvVar12 = realloc(c2m_ctx_00,(size_t)pnVar23);
              puVar5[2] = (ulong)pvVar12;
            }
            puVar5[1] = uVar24;
            *puVar5 = uVar24;
            lVar14 = htab->env[0].__jmpbuf[4];
            if (lVar14 == 0) goto LAB_001894d3;
            lVar14 = *(long *)(lVar14 + 0x10);
            uVar10 = *(uint *)((long)&htab->ctx + 4);
            offset = (node_t_conflict)(ulong)uVar10;
            uVar2 = *(uint *)&htab->options;
            *(undefined4 *)&htab->ctx = 0;
            *(undefined4 *)&htab->options = 0;
            *(undefined4 *)((long)&htab->ctx + 4) = 0;
            if (uVar10 < uVar2) {
              lVar18 = (ulong)uVar2 - (long)offset;
              offset = (node_t_conflict)((long)offset * 0x10);
              puVar29 = (undefined8 *)((long)&offset->attr + lVar14);
              do {
                if (*(int *)(puVar29 + -1) != 0) {
                  offset = (node_t_conflict)pcVar16;
                  HTAB_case_t_do((HTAB_case_t *)htab,(case_t_conflict)*puVar29,HTAB_INSERT,
                                 (case_t_conflict *)pcVar16);
                  (*(code *)htab->env[0].__jmpbuf[2])(*(case_t_conflict *)pcVar16,*puVar29,pnVar6);
                }
                puVar29 = puVar29 + 2;
                lVar18 = lVar18 + -1;
              } while (lVar18 != 0);
            }
LAB_0018938c:
            iVar9 = (*(code *)htab->env[0].__jmpbuf[1])(pnVar22,pnVar6);
            nVar21 = iVar9 + (uint)(iVar9 == 0);
            pnVar23 = (node_t_conflict)(ulong)nVar21;
            lVar14 = htab->env[0].__jmpbuf[5];
            if (lVar14 == 0) {
LAB_001894ba:
              HTAB_case_t_do_cold_2();
              c2m_ctx_00 = htab;
            }
            else {
              offset = (node_t_conflict)htab->env[0].__jmpbuf[4];
              c2m_ctx_00 = htab;
              if (offset != (node_t_conflict)0x0) {
                lVar14 = *(long *)(lVar14 + 0x10);
                pnVar15 = (offset->op_link).prev;
                puVar19 = (uint *)0x0;
                nVar31 = nVar21;
                nVar28 = nVar21;
                do {
                  nVar28 = nVar28 & uVar27 - N_I;
                  puVar17 = (uint *)(lVar14 + (ulong)nVar28 * 4);
                  uVar24 = (ulong)*puVar17;
                  if (uVar24 != 0xfffffffe) {
                    if (*puVar17 == 0xffffffff) {
                      if (extraout_EDX != 1) {
                        return;
                      }
                      *(int *)&htab->ctx = *(int *)&htab->ctx + 1;
                      if (puVar19 != (uint *)0x0) {
                        puVar17 = puVar19;
                      }
                      uVar10 = *(uint *)&htab->options;
                      (&pnVar15->code)[(ulong)uVar10 * 4] = nVar21;
                      (&pnVar15->attr)[(ulong)uVar10 * 2] = pnVar22;
                      *(uint *)&htab->options = uVar10 + 1;
                      *puVar17 = uVar10;
                      goto LAB_00189499;
                    }
                    puVar17 = puVar19;
                    if (((&pnVar15->code)[uVar24 * 4] == nVar21) &&
                       (iVar9 = (*(code *)htab->env[0].__jmpbuf[2])
                                          ((&pnVar15->attr)[uVar24 * 2],pnVar22,pnVar6), iVar9 != 0)
                       ) {
                      pnVar22 = (node_t_conflict)(&pnVar15->attr)[uVar24 * 2];
LAB_00189499:
                      *(node_t_conflict *)pcVar16 = pnVar22;
                      return;
                    }
                  }
                  nVar31 = nVar31 >> 0xb;
                  nVar28 = nVar31 + N_I + nVar28 * 5;
                  piVar8 = (int *)((long)&htab->options + 4);
                  *piVar8 = *piVar8 + 1;
                  puVar19 = puVar17;
                } while( true );
              }
            }
            htab = (c2m_ctx_t)in_R8;
            HTAB_case_t_do_cold_1();
LAB_001894c4:
            HTAB_case_t_do_cold_4();
LAB_001894c9:
            HTAB_case_t_do_cold_6();
LAB_001894ce:
            HTAB_case_t_do_cold_5();
LAB_001894d3:
            HTAB_case_t_do_cold_3();
            do {
              pnVar22 = (node_t_conflict)pnVar23->attr;
              if ((pnVar22->code & N_I) != N_IGNORE) {
                pnVar15 = (pnVar22->op_link).next;
                iVar9 = *(int *)&(pnVar15->op_link).next;
                if (iVar9 == 1) {
                  bVar32 = pnVar15[1].code - N_L < 0xc;
                }
                else {
                  bVar32 = false;
                }
                if ((iVar9 == 2) || (bVar32)) {
                  *base = (node_t_conflict)0x0;
                  uVar10 = pnVar22[1].uid;
                  offset->code = pnVar22[1].code;
                  offset->uid = uVar10;
                  goto LAB_00189942;
                }
              }
              iVar9 = pnVar23->code;
              if (iVar9 != 0x3f) {
                if (iVar9 < 0x28) {
                  if (iVar9 - 0xdU < 3) {
                    *base = pnVar23;
                    *(case_t_conflict *)offset = (case_t_conflict)0x0;
                    *(node_code_t *)&htab->ctx = N_IGNORE;
                    return;
                  }
                  if (iVar9 != 0x10) {
                    return;
                  }
                  pnVar15 = (pnVar22->op_link).prev;
                  if (pnVar15 == (node_t)0x0) {
                    return;
                  }
                  if ((pnVar15->code == N_FUNC_DEF) ||
                     ((pnVar15->code == N_SPEC_DECL &&
                      (*(int *)(*(long *)((long)pnVar15->attr + 0x40) + 0x18) == 7)))) {
                    *base = pnVar15;
                    nVar21 = N_IGNORE;
                  }
                  else {
                    if (pnVar22->attr == (void *)0x0) {
                      return;
                    }
                    lVar14 = *(long *)((long)pnVar22->attr + 8);
                    if ((*(node_t_conflict *)(lVar14 + 0x18) != c2m_ctx_00->top_scope) &&
                       (*(int *)(lVar14 + 0x38) != 0)) {
                      return;
                    }
                    *base = pnVar15;
                    nVar21 = (node_code_t)(((pnVar22->op_link).next)->attr == (void *)0x0);
                  }
                  *(node_code_t *)&htab->ctx = nVar21;
                  *(case_t_conflict *)offset = (case_t_conflict)0x0;
                  return;
                }
                switch(iVar9) {
                case 0x28:
                case 0x2a:
                  pnVar15 = (pnVar23->u).ops.head;
                  pnVar30 = pnVar15;
                  if (pnVar15 != (node_t)0x0) {
                    pnVar30 = (pnVar15->op_link).next;
                  }
                  if (pnVar30 == (node_t)0x0) {
                    return;
                  }
                  pnVar11 = pnVar15;
                  if ((iVar9 == 0x28) && ((*pnVar15->attr & 1) != 0)) {
                    pnVar11 = pnVar30;
                    pnVar30 = pnVar15;
                  }
                  iVar9 = check_const_addr_p(c2m_ctx_00,pnVar11,base,(mir_llong *)offset,(int *)htab
                                            );
                  if (iVar9 == 0) {
                    return;
                  }
                  if ((*(node_code_t *)&htab->ctx != N_IGNORE) &&
                     (*(long *)(*(long *)((long)pnVar11->attr + 0x18) + 8) == 0)) {
                    return;
                  }
                  pbVar7 = (byte *)pnVar30->attr;
                  if ((*pbVar7 & 1) == 0) {
                    if ((*pbVar7 & 2) == 0) {
                      return;
                    }
                    if (*(int **)(pbVar7 + 0x10) == (int *)0x0) {
                      return;
                    }
                    if (**(int **)(pbVar7 + 0x10) != 0x53) {
                      return;
                    }
                  }
                  pnVar15 = (((node_t_conflict)pnVar23->attr)->op_link).next;
                  uVar10 = *(uint *)&(pnVar15->op_link).next;
                  mVar13 = (mir_size_t)uVar10;
                  if (mVar13 != 1) {
                    if (uVar10 != 3) {
                      __assert_fail("type->mode == TM_BASIC || type->mode == TM_PTR",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                    ,0x1d85,
                                    "int check_const_addr_p(c2m_ctx_t, node_t, node_t *, mir_llong *, int *)"
                                   );
                    }
                    ptVar4 = *(type **)(pnVar15 + 1);
                    mVar13 = 1;
                    if (ptVar4->mode != TM_FUNC) {
                      ptVar20 = ptVar4->arr_type;
                      if (ptVar4->arr_type == (type *)0x0) {
                        ptVar20 = ptVar4;
                      }
                      mVar13 = raw_type_size(c2m_ctx_00,ptVar20);
                      uVar24 = (ulong)ptVar20->align;
                      if (uVar24 != 0) {
                        uVar1 = (mVar13 - 1) + uVar24;
                        mVar13 = uVar1 - uVar1 % uVar24;
                      }
                    }
                  }
                  lVar14 = -(mVar13 * *(long *)(pbVar7 + 0x30));
                  if (pnVar23->code == 0x28) {
                    lVar14 = mVar13 * *(long *)(pbVar7 + 0x30);
                  }
                  *(case_t_conflict *)offset =
                       (case_t_conflict)((long)&(*(case_t_conflict *)offset)->case_node + lVar14);
                  return;
                case 0x29:
                case 0x2b:
                case 0x2c:
                case 0x2d:
                case 0x2e:
                case 0x2f:
                case 0x30:
                case 0x31:
                  return;
                case 0x32:
                  pnVar22 = (pnVar23->u).ops.head;
                  if (*(int *)(*(long *)((long)pnVar22->attr + 0x18) + 0x18) != 3) {
                    return;
                  }
                  iVar9 = check_const_addr_p(c2m_ctx_00,pnVar22,base,(mir_llong *)offset,(int *)htab
                                            );
                  if (iVar9 == 0) {
                    return;
                  }
                  pnVar15 = (pnVar23->u).ops.head;
                  if (pnVar15 != (node_t)0x0) {
                    pnVar15 = (pnVar15->op_link).next;
                  }
                  pbVar7 = (byte *)pnVar15->attr;
                  if ((*pbVar7 & 1) == 0) {
                    return;
                  }
                  ptVar4 = (type *)(((node_t_conflict)pnVar23->attr)->op_link).next;
                  ptVar20 = ptVar4->arr_type;
                  if (ptVar20 == (type *)0x0) {
                    ptVar20 = ptVar4;
                  }
                  mVar13 = raw_type_size(c2m_ctx_00,ptVar20);
                  uVar24 = (ulong)ptVar20->align;
                  if (uVar24 != 0) {
                    uVar1 = (mVar13 - 1) + uVar24;
                    mVar13 = uVar1 - uVar1 % uVar24;
                  }
                  *(node_code_t *)&htab->ctx = N_I;
                  *(case_t_conflict *)offset =
                       (case_t_conflict)
                       ((long)&(*(case_t_conflict *)offset)->case_node +
                       mVar13 * *(long *)(pbVar7 + 0x30));
                  return;
                case 0x33:
                case 0x36:
                  iVar9 = check_const_addr_p(c2m_ctx_00,(pnVar23->u).ops.head,base,
                                             (mir_llong *)offset,(int *)htab);
                  if (iVar9 == 0) {
                    return;
                  }
                  if (*(node_code_t *)&htab->ctx != (uint)(pnVar23->code == 0x33)) {
                    return;
                  }
                  *(node_code_t *)&htab->ctx = N_I;
                  pvVar12 = ((node_t_conflict)pnVar23->attr)->attr;
                  if (pvVar12 == (void *)0x0) {
                    return;
                  }
                  *(case_t_conflict *)offset =
                       (case_t_conflict)
                       ((long)&(*(case_t_conflict *)offset)->case_node +
                       *(long *)(*(long *)((long)pvVar12 + 8) + 0x10));
                  return;
                case 0x34:
                case 0x35:
                  pnVar22 = (pnVar23->u).ops.head;
                  pvVar12 = pnVar22->attr;
                  iVar9 = check_const_addr_p(c2m_ctx_00,pnVar22,base,(mir_llong *)offset,(int *)htab
                                            );
                  if (iVar9 == 0) {
                    return;
                  }
                  if (pnVar23->code == 0x34) {
                    lVar14 = *(long *)((long)pvVar12 + 0x18);
                    iVar9 = *(int *)(lVar14 + 0x18);
                    if ((iVar9 == 6) || ((iVar9 == 3 && (*(long *)(lVar14 + 8) != 0)))) {
                      if ((int)*(node_code_t *)&htab->ctx < 1) {
                        return;
                      }
                      *(node_code_t *)&htab->ctx = *(node_code_t *)&htab->ctx - N_I;
                      return;
                    }
                  }
                  if (pnVar22->code == N_ID) {
                    piVar8 = *(int **)((long)pvVar12 + 0x10);
                    iVar9 = *piVar8;
                    if (iVar9 == 0x7d) {
                      return;
                    }
                    if ((iVar9 == 0x55) &&
                       (*(int *)(*(long *)(*(long *)(piVar8 + 2) + 0x40) + 0x18) == 7)) {
                      return;
                    }
                  }
                  if (pnVar23->code == 0x35) {
                    nVar21 = *(node_code_t *)&htab->ctx + N_I;
                  }
                  else {
                    nVar21 = *(node_code_t *)&htab->ctx - N_I;
                  }
                  *(node_code_t *)&htab->ctx = nVar21;
                  return;
                default:
                  if (iVar9 != 0x53) {
                    return;
                  }
                  *base = pnVar23;
                  *(case_t_conflict *)offset = (case_t_conflict)0x0;
                }
LAB_00189942:
                *(node_code_t *)&htab->ctx = N_IGNORE;
                return;
              }
              ptVar4 = *(type **)((long)((pnVar23->u).ops.head)->attr + 0x18);
              mVar13 = raw_type_size(c2m_ctx_00,ptVar4);
              uVar24 = (ulong)ptVar4->align;
              if (uVar24 != 0) {
                uVar1 = (mVar13 - 1) + uVar24;
                mVar13 = uVar1 - uVar1 % uVar24;
              }
              if (mVar13 != 8) {
                return;
              }
              pnVar23 = (pnVar23->u).ops.head;
              if (pnVar23 != (node_t)0x0) {
                pnVar23 = (pnVar23->op_link).next;
              }
            } while( true );
          }
        }
        HTAB_case_t_do_cold_7();
        goto LAB_001894ba;
      }
      pcVar16 = (char *)(pnVar30->op_link).prev;
      if ((node_t_conflict)pcVar16 == (node_t_conflict)0x0) {
        if (*ppnVar26 != pnVar30) goto LAB_001891f0;
        (pnVar30->op_link).prev = pnVar11;
        (pnVar11->op_link).next = pnVar30;
        (pnVar11->op_link).prev = (node_t)0x0;
        *ppnVar26 = pnVar11;
      }
      else {
        if (*ppnVar26 == (node_t)0x0) goto LAB_001891e6;
        (((node_t_conflict)pcVar16)->op_link).next = pnVar11;
        (pnVar11->op_link).prev = (node_t)pcVar16;
        (pnVar30->op_link).prev = pnVar11;
        (pnVar11->op_link).next = pnVar30;
      }
    }
    else {
      pcVar16 = *(char **)&ptVar4[1].align;
      if ((node_t)pcVar16 == (node_t)0x0) {
        lVar14._0_4_ = ptVar4[1].mode;
        lVar14._4_1_ = ptVar4[1].func_type_before_adjustment_p;
        lVar14._5_1_ = ptVar4[1].unnamed_anon_struct_union_member_type_p;
        lVar14._6_2_ = *(undefined2 *)&ptVar4[1].field_0x1e;
        if (lVar14 != 0) goto LAB_001891eb;
      }
      else {
        if ((((node_t)pcVar16)->op_link).next != (node_t)0x0) goto LAB_001891e1;
        ppnVar26 = &(((node_t)pcVar16)->op_link).next;
      }
      *ppnVar26 = pnVar11;
      (pnVar11->op_link).next = (node_t)0x0;
      (pnVar11->op_link).prev = (node_t)pcVar16;
      *(node_t *)&ptVar4[1].align = pnVar11;
    }
  }
LAB_0018900c:
  pnVar15 = (pnVar15->op_link).next;
  if (pnVar15 == (node_t)0x0) {
    return;
  }
  goto LAB_00188f35;
}

Assistant:

static void check_labels (c2m_ctx_t c2m_ctx, node_t labels, node_t target) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;

  for (node_t l = NL_HEAD (labels->u.ops); l != NULL; l = NL_NEXT (l)) {
    if (l->code == N_LABEL) {
      symbol_t sym;
      node_t id = NL_HEAD (l->u.ops);

      if (symbol_find (c2m_ctx, S_LABEL, id, func_block_scope, &sym)) {
        error (c2m_ctx, POS (id), "label %s redeclaration", id->u.s.s);
      } else {
        symbol_insert (c2m_ctx, S_LABEL, id, func_block_scope, target, NULL);
      }
    } else if (curr_switch == NULL) {
      error (c2m_ctx, POS (l), "%s not within a switch-stmt",
             l->code == N_CASE ? "case label" : "default label");
    } else {
      struct switch_attr *switch_attr = curr_switch->attr;
      struct type *type = &switch_attr->type;
      node_t case_expr = l->code == N_CASE ? NL_HEAD (l->u.ops) : NULL;
      node_t case_expr2 = l->code == N_CASE ? NL_EL (l->u.ops, 1) : NULL;
      case_t case_attr, tail = DLIST_TAIL (case_t, switch_attr->case_labels);
      int ok_p = FALSE, default_p = tail != NULL && tail->case_node->code == N_DEFAULT;

      if (case_expr == NULL) {
        if (default_p) {
          error (c2m_ctx, POS (l), "multiple default labels in one switch");
        } else {
          ok_p = TRUE;
        }
      } else {
        ok_p = check_case_expr (c2m_ctx, case_expr, type, target);
        if (case_expr2 != NULL) {
          ok_p = check_case_expr (c2m_ctx, case_expr2, type, target) && ok_p;
          (c2m_options->pedantic_p ? error : warning) (c2m_ctx, POS (l),
                                                       "range cases are not a part of C standard");
        }
      }
      if (ok_p) {
        case_attr = reg_malloc (c2m_ctx, sizeof (struct case_attr));
        case_attr->case_node = l;
        case_attr->case_target_node = target;
        if (default_p) {
          DLIST_INSERT_BEFORE (case_t, switch_attr->case_labels, tail, case_attr);
        } else {
          DLIST_APPEND (case_t, switch_attr->case_labels, case_attr);
        }
      }
    }
  }
}